

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* duckdb::BitpackingGetSegmentInfo<long>
            (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,ColumnSegment *segment)

{
  ulong uVar1;
  mapped_type_conflict *pmVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  _Base_ptr p_Var4;
  ulong uVar5;
  map<duckdb::BitpackingMode,_unsigned_long,_std::less<duckdb::BitpackingMode>,_std::allocator<std::pair<const_duckdb::BitpackingMode,_unsigned_long>_>_>
  counts;
  BitpackingScanState<long,_long> scan_state;
  allocator local_4131;
  case_insensitive_map_t<idx_t> *local_4130;
  string local_4128;
  string local_4108;
  string local_40e8;
  _Rb_tree<duckdb::BitpackingMode,_std::pair<const_duckdb::BitpackingMode,_unsigned_long>,_std::_Select1st<std::pair<const_duckdb::BitpackingMode,_unsigned_long>_>,_std::less<duckdb::BitpackingMode>,_std::allocator<std::pair<const_duckdb::BitpackingMode,_unsigned_long>_>_>
  local_40c8;
  BitpackingScanState<long,_long> local_4098;
  
  local_40c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_40c8._M_impl.super__Rb_tree_header._M_header;
  local_40c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_40c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_40c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar1 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  local_40c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_40c8._M_impl.super__Rb_tree_header._M_header._M_left;
  BitpackingScanState<long,_long>::BitpackingScanState(&local_4098,segment);
  if (uVar1 != 0) {
    uVar5 = 0;
    do {
      if (uVar5 != 0) {
        BitpackingScanState<long,_long>::LoadNextGroup(&local_4098);
      }
      pmVar2 = ::std::
               map<duckdb::BitpackingMode,_unsigned_long,_std::less<duckdb::BitpackingMode>,_std::allocator<std::pair<const_duckdb::BitpackingMode,_unsigned_long>_>_>
               ::operator[]((map<duckdb::BitpackingMode,_unsigned_long,_std::less<duckdb::BitpackingMode>,_std::allocator<std::pair<const_duckdb::BitpackingMode,_unsigned_long>_>_>
                             *)&local_40c8,&local_4098.current_group.mode);
      *pmVar2 = *pmVar2 + 1;
      uVar5 = uVar5 + 0x800;
    } while (uVar5 < uVar1);
  }
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_buckets =
       &(__return_storage_ptr__->map_idx)._M_h._M_single_bucket;
  (__return_storage_ptr__->map_idx)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->map_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_element_count = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if ((_Rb_tree_header *)local_40c8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_40c8._M_impl.super__Rb_tree_header) {
    local_4130 = &__return_storage_ptr__->map_idx;
    p_Var4 = local_40c8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_4108._M_dataplus._M_p = (pointer)&local_4108.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_4108,"%d","");
      Exception::ConstructMessage<unsigned_long>
                (&local_40e8,&local_4108,(unsigned_long)p_Var4[1]._M_parent);
      pcVar3 = EnumUtil::ToChars<duckdb::BitpackingMode>((BitpackingMode)p_Var4[1]._M_color);
      ::std::__cxx11::string::string((string *)&local_4128,pcVar3,&local_4131);
      this = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](__return_storage_ptr__,&local_4128);
      ::std::__cxx11::string::operator=((string *)this,(string *)&local_40e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4128._M_dataplus._M_p != &local_4128.field_2) {
        operator_delete(local_4128._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40e8._M_dataplus._M_p != &local_40e8.field_2) {
        operator_delete(local_40e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4108._M_dataplus._M_p != &local_4108.field_2) {
        operator_delete(local_4108._M_dataplus._M_p);
      }
      p_Var4 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != &local_40c8._M_impl.super__Rb_tree_header);
  }
  local_4098.super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__BitpackingScanState_02445838;
  BufferHandle::~BufferHandle(&local_4098.handle);
  ::std::
  _Rb_tree<duckdb::BitpackingMode,_std::pair<const_duckdb::BitpackingMode,_unsigned_long>,_std::_Select1st<std::pair<const_duckdb::BitpackingMode,_unsigned_long>_>,_std::less<duckdb::BitpackingMode>,_std::allocator<std::pair<const_duckdb::BitpackingMode,_unsigned_long>_>_>
  ::~_Rb_tree(&local_40c8);
  return __return_storage_ptr__;
}

Assistant:

InsertionOrderPreservingMap<string> BitpackingGetSegmentInfo(ColumnSegment &segment) {
	map<BitpackingMode, idx_t> counts;
	auto tuple_count = segment.count.load();
	BitpackingScanState<T> scan_state(segment);
	for (idx_t i = 0; i < tuple_count; i += BITPACKING_METADATA_GROUP_SIZE) {
		if (i) {
			scan_state.LoadNextGroup();
		}
		counts[scan_state.current_group.mode]++;
	}

	InsertionOrderPreservingMap<string> result;
	for (auto &it : counts) {
		auto &mode = it.first;
		auto &count = it.second;
		result[EnumUtil::ToString(mode)] = StringUtil::Format("%d", count);
	}
	return result;
}